

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validator.cpp
# Opt level: O0

ValueLength ReadVariableLengthValue<false>(uint8_t **p,uint8_t *end)

{
  byte bVar1;
  char *msg;
  long in_RSI;
  long *in_RDI;
  uint8_t c;
  ValueLength shifter;
  ValueLength value;
  undefined3 uVar2;
  ExceptionType in_stack_ffffffffffffffdc;
  Exception *this;
  ValueLength local_18;
  
  local_18 = 0;
  this = (Exception *)0x0;
  do {
    bVar1 = *(byte *)*in_RDI;
    local_18 = ((ulong)(bVar1 & 0x7f) << ((byte)this & 0x3f)) + local_18;
    this = (Exception *)((long)this + 7);
    *in_RDI = *in_RDI + 1;
    if ((bVar1 & 0x80) == 0) {
      return local_18;
    }
    uVar2 = CONCAT12(1,(short)in_stack_ffffffffffffffdc);
    if (*in_RDI != in_RSI) {
      uVar2 = CONCAT12(0x38 < this,(short)in_stack_ffffffffffffffdc);
    }
    in_stack_ffffffffffffffdc = CONCAT13(bVar1,uVar2);
  } while ((char)((uint3)uVar2 >> 0x10) == '\0');
  msg = (char *)__cxa_allocate_exception(0x18);
  arangodb::velocypack::Exception::Exception(this,in_stack_ffffffffffffffdc,msg);
  __cxa_throw(msg,&arangodb::velocypack::Exception::typeinfo,
              arangodb::velocypack::Exception::~Exception);
}

Assistant:

static ValueLength ReadVariableLengthValue(uint8_t const*& p,
                                           uint8_t const* end) {
  ValueLength value = 0;
  ValueLength shifter = 0;
  while (true) {
    uint8_t c = *p;
    VELOCYPACK_ASSERT(shifter <= 8 * 7);
    value += static_cast<ValueLength>(c & 0x7fU) << shifter;
    shifter += 7;
    if (reverse) {
      --p;
    } else {
      ++p;
    }
    if (!(c & 0x80U)) {
      break;
    }
    if (VELOCYPACK_UNLIKELY(p == end || shifter > 7 * 8)) {
      throw Exception(Exception::ValidatorInvalidLength,
                      "Compound value length value is out of bounds");
    }
  }
  return value;
}